

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::RemoveEmptyLoops(BackwardPass *this)

{
  Loop *pLVar1;
  JitArenaAllocator *this_00;
  SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  BVSparseNode *this_02;
  BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar3;
  BVSparse<Memory::JitArenaAllocator> *obj;
  Loop *loop;
  bool bVar4;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_03;
  FunctionJITTimeInfo *this_04;
  
  this_03 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_03);
  this_04 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_04);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,MemOpPhase,sourceContextId,functionId);
  if (!bVar4) {
    pLVar1 = this->func->m_fg->loopList;
    while (loop = pLVar1, loop != (Loop *)0x0) {
      pLVar1 = loop->next;
      bVar4 = IsEmptyLoopAfterMemOp(this,loop);
      if (bVar4) {
        RestoreInductionVariableValuesAfterMemOp(this,loop);
        RemoveEmptyLoopAfterMemOp(this,loop);
      }
      if (loop->memOpInfo != (MemOpInfo *)0x0) {
        this_00 = this->func->topFunc->m_fg->alloc;
        this_01 = &loop->memOpInfo->candidates->
                   super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>;
        if (this_01 != (SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Clear(this_01);
          this_02 = (BVSparseNode *)loop->memOpInfo->candidates;
          SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::~SList
                    ((SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)this_02);
          (((SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)&this_02->next)
          ->super_SListNodeBase<Memory::ArenaAllocator>).next = (Type)this_00->bvFreeList;
          this_00->bvFreeList = this_02;
        }
        pBVar2 = loop->memOpInfo->inductionVariableChangeInfoMap;
        if (pBVar2 != (BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)0x0) {
          JsUtil::
          BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Clear(pBVar2);
          pBVar2 = loop->memOpInfo->inductionVariableChangeInfoMap;
          JsUtil::
          BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::~BaseDictionary(pBVar2);
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
                     pBVar2,0x38);
        }
        pBVar3 = loop->memOpInfo->inductionVariableOpndPerUnrollMap;
        if (pBVar3 != (BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)0x0) {
          JsUtil::
          BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Clear(pBVar3);
          pBVar3 = loop->memOpInfo->inductionVariableOpndPerUnrollMap;
          JsUtil::
          BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::~BaseDictionary(pBVar3);
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
                     pBVar3,0x38);
        }
        obj = loop->memOpInfo->inductionVariablesUsedAfterLoop;
        if (obj != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          Memory::
          DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                    (this->tempAlloc,obj);
        }
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
                   loop->memOpInfo,0x48);
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::RemoveEmptyLoops()
{
    if (PHASE_OFF(Js::MemOpPhase, this->func))
    {
        return;

    }
    const auto DeleteMemOpInfo = [&](Loop *loop)
    {
        JitArenaAllocator *alloc = this->func->GetTopFunc()->m_fg->alloc;

        if (!loop->memOpInfo)
        {
            return;
        }

        if (loop->memOpInfo->candidates)
        {
            loop->memOpInfo->candidates->Clear();
            JitAdelete(alloc, loop->memOpInfo->candidates);
        }

        if (loop->memOpInfo->inductionVariableChangeInfoMap)
        {
            loop->memOpInfo->inductionVariableChangeInfoMap->Clear();
            JitAdelete(alloc, loop->memOpInfo->inductionVariableChangeInfoMap);
        }

        if (loop->memOpInfo->inductionVariableOpndPerUnrollMap)
        {
            loop->memOpInfo->inductionVariableOpndPerUnrollMap->Clear();
            JitAdelete(alloc, loop->memOpInfo->inductionVariableOpndPerUnrollMap);
        }

        if (loop->memOpInfo->inductionVariablesUsedAfterLoop)
        {
            JitAdelete(this->tempAlloc, loop->memOpInfo->inductionVariablesUsedAfterLoop);
        }
        JitAdelete(alloc, loop->memOpInfo);
    };

    FOREACH_LOOP_IN_FUNC_EDITING(loop, this->func)
    {
        if (IsEmptyLoopAfterMemOp(loop))
        {
            RestoreInductionVariableValuesAfterMemOp(loop);
            RemoveEmptyLoopAfterMemOp(loop);
        }
        // Remove memop info as we don't need them after this point.
        DeleteMemOpInfo(loop);

    } NEXT_LOOP_IN_FUNC_EDITING;

}